

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

external_size_type __thiscall foxxll::config::total_size(config *this)

{
  external_size_type eVar1;
  pointer pdVar2;
  
  if (this->is_initialized != false) {
    eVar1 = 0;
    for (pdVar2 = (this->disks_list).
                  super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar2 != (this->disks_list).
                  super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
      eVar1 = eVar1 + pdVar2->size;
    }
    return eVar1;
  }
  __assert_fail("is_initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/config.cpp"
                ,0x113,"external_size_type foxxll::config::total_size() const");
}

Assistant:

external_size_type config::total_size() const
{
    assert(is_initialized);

    external_size_type total_size = 0;

    for (disk_list_type::const_iterator it = disks_list.begin();
         it != disks_list.end(); it++)
    {
        total_size += it->size;
    }

    return total_size;
}